

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_harmonic_symplectic.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  undefined8 uVar2;
  int iVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  longdouble lVar4;
  double dVar5;
  sunrealtype sVar6;
  double dVar7;
  double dVar8;
  sunrealtype err;
  sunrealtype tout;
  sunrealtype tret;
  sunrealtype omega;
  sunrealtype phi;
  sunrealtype A;
  sunrealtype T0;
  sunrealtype dTout;
  sunrealtype dt;
  sunrealtype Tf;
  int num_output_times;
  int use_compsums;
  int order;
  int retval;
  int iout;
  void *arkode_mem;
  sunrealtype *ydata;
  N_Vector solution;
  N_Vector y;
  SUNContext sunctx;
  UserData udata;
  ProgramArgs args;
  undefined4 uVar9;
  int in_stack_fffffffffffffe5c;
  undefined2 in_stack_fffffffffffffe60;
  undefined2 uVar10;
  undefined6 in_stack_fffffffffffffe62;
  char **in_stack_fffffffffffffe68;
  UserData *udata_00;
  undefined2 in_stack_fffffffffffffe70;
  undefined2 uVar11;
  undefined2 in_stack_fffffffffffffe72;
  undefined4 in_stack_fffffffffffffe74;
  N_Vector y_00;
  undefined2 in_stack_fffffffffffffe80;
  undefined2 uVar12;
  undefined6 in_stack_fffffffffffffe82;
  sunrealtype in_stack_fffffffffffffe88;
  sunrealtype dt_00;
  undefined2 in_stack_fffffffffffffe90;
  undefined2 uVar13;
  undefined6 in_stack_fffffffffffffe92;
  double local_160;
  double local_150;
  double local_d0;
  double local_c8 [8];
  int local_84;
  undefined4 local_80;
  int local_7c;
  int local_78;
  int local_74;
  undefined8 local_70;
  double *local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  int local_30;
  int local_2c;
  undefined4 local_28;
  int local_24;
  double local_20;
  double local_18;
  int local_4;
  
  local_4 = 0;
  local_50 = 0;
  local_58 = 0;
  local_60 = 0;
  local_68 = (double *)0x0;
  local_70 = 0;
  local_74 = 0;
  local_78 = 0;
  local_7c = 0;
  local_80 = 0;
  local_84 = 0;
  local_c8[7] = 0.0;
  local_c8[6] = 0.0;
  local_c8[5] = 0.0;
  local_c8[4] = 0.0;
  local_c8[3] = 10.0;
  local_c8[2] = 0.0;
  local_c8[1] = 1.0;
  iVar3 = ParseArgs(CONCAT22(in_stack_fffffffffffffe72,in_stack_fffffffffffffe70),
                    in_stack_fffffffffffffe68,
                    (ProgramArgs *)CONCAT62(in_stack_fffffffffffffe62,in_stack_fffffffffffffe60));
  if (iVar3 == 0) {
    local_7c = local_30;
    local_80 = local_28;
    local_84 = local_2c;
    local_c8[7] = local_20;
    local_c8[6] = local_18;
    local_c8[5] = (local_20 - 0.0) / (double)local_2c;
    local_78 = SUNContext_Create(0,&local_50);
    iVar3 = check_retval(in_stack_fffffffffffffe68,
                         (char *)CONCAT62(in_stack_fffffffffffffe62,in_stack_fffffffffffffe60),
                         in_stack_fffffffffffffe5c);
    if (iVar3 == 0) {
      printf("\n   Begin simple harmonic oscillator problem\n\n");
      local_48 = 0x4024000000000000;
      local_40 = 0;
      local_38 = 0x3ff0000000000000;
      local_58 = N_VNew_Serial(2,local_50);
      local_60 = N_VClone(local_58);
      local_68 = (double *)N_VGetArrayPointer(local_58);
      dVar5 = cos(0.0);
      *local_68 = dVar5 * 10.0;
      dVar5 = sin(0.0);
      local_68[1] = dVar5 * -10.0;
      local_70 = SPRKStepCreate(0,xdot,vdot,local_58,local_50);
      local_78 = ARKodeSetOrder(local_70,local_7c);
      iVar3 = check_retval(in_stack_fffffffffffffe68,
                           (char *)CONCAT62(in_stack_fffffffffffffe62,in_stack_fffffffffffffe60),
                           in_stack_fffffffffffffe5c);
      if (iVar3 == 0) {
        local_78 = ARKodeSetUserData(local_70,&local_48);
        iVar3 = check_retval(in_stack_fffffffffffffe68,
                             (char *)CONCAT62(in_stack_fffffffffffffe62,in_stack_fffffffffffffe60),
                             in_stack_fffffffffffffe5c);
        if (iVar3 == 0) {
          local_78 = SPRKStepSetUseCompensatedSums(local_70,local_80);
          iVar3 = check_retval(in_stack_fffffffffffffe68,
                               (char *)CONCAT62(in_stack_fffffffffffffe62,in_stack_fffffffffffffe60)
                               ,in_stack_fffffffffffffe5c);
          if (iVar3 == 0) {
            local_78 = ARKodeSetFixedStep(local_c8[6],local_70);
            iVar3 = check_retval(in_stack_fffffffffffffe68,
                                 (char *)CONCAT62(in_stack_fffffffffffffe62,
                                                  in_stack_fffffffffffffe60),
                                 in_stack_fffffffffffffe5c);
            uVar2 = local_70;
            if (iVar3 == 0) {
              dVar5 = ceil(local_c8[7] / local_c8[6]);
              local_78 = ARKodeSetMaxNumSteps(uVar2,(long)dVar5 + 2);
              iVar3 = check_retval(in_stack_fffffffffffffe68,
                                   (char *)CONCAT62(in_stack_fffffffffffffe62,
                                                    in_stack_fffffffffffffe60),
                                   in_stack_fffffffffffffe5c);
              pFVar1 = _stdout;
              if (iVar3 == 0) {
                local_c8[0] = 0.0;
                local_d0 = local_c8[5] + 0.0;
                dVar5 = *local_68;
                sVar6 = Energy((N_Vector)
                               CONCAT62(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90),
                               in_stack_fffffffffffffe88,
                               (UserData *)
                               CONCAT62(in_stack_fffffffffffffe82,in_stack_fffffffffffffe80));
                dt_00 = SUB108((longdouble)0,0);
                uVar13 = (undefined2)((unkuint10)(longdouble)0 >> 0x40);
                y_00 = SUB108((longdouble)sVar6,0);
                uVar12 = (undefined2)((unkuint10)(longdouble)sVar6 >> 0x40);
                udata_00 = SUB108((longdouble)dVar5,0);
                uVar11 = (undefined2)((unkuint10)(longdouble)dVar5 >> 0x40);
                uVar9 = SUB104((longdouble)0.0,0);
                uVar10 = (undefined2)((unkuint10)(longdouble)0.0 >> 0x40);
                fprintf(pFVar1,"t = %.6Lf, x(t) = %.6Lf, E = %.6Lf, sol. err = %.6Lf\n");
                for (local_74 = 0; local_74 < local_84; local_74 = local_74 + 1) {
                  if (local_24 != 0) {
                    ARKodeSetStopTime(local_d0,local_70);
                  }
                  local_78 = ARKodeEvolve(local_d0,local_70,local_58,local_c8,1,in_R8,in_R9,uVar9,
                                          uVar10);
                  Solution((sunrealtype)CONCAT62(in_stack_fffffffffffffe82,uVar12),y_00,
                           (N_Vector)
                           CONCAT44(in_stack_fffffffffffffe74,
                                    CONCAT22(in_stack_fffffffffffffe72,uVar11)),udata_00);
                  N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,local_58,local_60);
                  dVar5 = (double)N_VDotProd(local_60);
                  dVar7 = sqrt(dVar5);
                  pFVar1 = _stdout;
                  lVar4 = (longdouble)local_c8[0];
                  dVar5 = *local_68;
                  sVar6 = Energy((N_Vector)CONCAT62(in_stack_fffffffffffffe92,uVar13),dt_00,
                                 (UserData *)CONCAT62(in_stack_fffffffffffffe82,uVar12));
                  dt_00 = SUB108((longdouble)dVar7,0);
                  uVar13 = (undefined2)((unkuint10)(longdouble)dVar7 >> 0x40);
                  y_00 = SUB108((longdouble)sVar6,0);
                  uVar12 = (undefined2)((unkuint10)(longdouble)sVar6 >> 0x40);
                  udata_00 = SUB108((longdouble)dVar5,0);
                  uVar11 = (undefined2)((unkuint10)(longdouble)dVar5 >> 0x40);
                  uVar9 = SUB104(lVar4,0);
                  uVar10 = (undefined2)((unkuint10)lVar4 >> 0x40);
                  fprintf(pFVar1,"t = %.6Lf, x(t) = %.6Lf, E = %.6Lf, sol. err = %.16Le\n");
                  dVar5 = local_c8[6];
                  dVar8 = pow(10.0,(double)(local_7c + -2));
                  local_150 = local_c8[6];
                  if (dVar5 / dVar8 <= 2.220446049250313e-13) {
                    local_150 = 2.220446049250313e-13;
                  }
                  else {
                    dVar5 = pow(10.0,(double)(local_7c + -2));
                    local_150 = local_150 / dVar5;
                  }
                  if (local_150 < dVar7) {
                    fprintf(_stderr,"FAILURE: solution error is too high\n");
                    return 1;
                  }
                  if (local_78 < 0) {
                    fprintf(_stderr,"Solver failure, stopping integration\n");
                    break;
                  }
                  local_160 = local_c8[5] + local_d0;
                  if (local_c8[7] < local_160) {
                    local_160 = local_c8[7];
                  }
                  local_d0 = local_160;
                }
                fprintf(_stdout,"\n");
                N_VDestroy(local_58);
                N_VDestroy(local_60);
                ARKodePrintAllStats(local_70,_stdout,0);
                ARKodeFree(&local_70);
                SUNContext_Free(&local_50);
                local_4 = 0;
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  ProgramArgs args;
  UserData udata;
  SUNContext sunctx       = NULL;
  N_Vector y              = NULL;
  N_Vector solution       = NULL;
  sunrealtype* ydata      = NULL;
  void* arkode_mem        = NULL;
  int iout                = 0;
  int retval              = 0;
  int order               = 0;
  int use_compsums        = 0;
  int num_output_times    = 0;
  sunrealtype Tf          = SUN_RCONST(0.0);
  sunrealtype dt          = SUN_RCONST(0.0);
  sunrealtype dTout       = SUN_RCONST(0.0);
  const sunrealtype T0    = SUN_RCONST(0.0);
  const sunrealtype A     = SUN_RCONST(10.0);
  const sunrealtype phi   = SUN_RCONST(0.0);
  const sunrealtype omega = SUN_RCONST(1.0);

  /* Parse the command line arguments */
  if (ParseArgs(argc, argv, &args)) { return 1; };

  /* Default integrator options and problem parameters */
  order            = args.order;
  use_compsums     = args.use_compsums;
  num_output_times = args.num_output_times;
  Tf               = args.Tf;
  dt               = args.dt;
  dTout            = (Tf - T0) / ((sunrealtype)num_output_times);

  /* Default problem parameters */

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  printf("\n   Begin simple harmonic oscillator problem\n\n");

  /* Allocate and fill udata structure */
  udata.A     = A;
  udata.phi   = phi;
  udata.omega = omega;

  /* Allocate our state vector [x, v]^T */
  y        = N_VNew_Serial(2, sunctx);
  solution = N_VClone(y);

  /* Fill the initial conditions (x0 then v0) */
  ydata    = N_VGetArrayPointer(y);
  ydata[0] = A * cos(phi);
  ydata[1] = -A * omega * sin(phi);

  /* Create SPRKStep integrator */
  arkode_mem = SPRKStepCreate(xdot, vdot, T0, y, sunctx);

  retval = ARKodeSetOrder(arkode_mem, order);
  if (check_retval(&retval, "ARKodeSetOrder", 1)) { return 1; }

  retval = ARKodeSetUserData(arkode_mem, &udata);
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

  retval = SPRKStepSetUseCompensatedSums(arkode_mem, use_compsums);
  if (check_retval(&retval, "SPRKStepSetUseCompensatedSums", 1)) { return 1; }

  retval = ARKodeSetFixedStep(arkode_mem, dt);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  retval = ARKodeSetMaxNumSteps(arkode_mem, ((long int)ceil(Tf / dt)) + 2);
  if (check_retval(&retval, "ARKodeSetMaxNumSteps", 1)) { return 1; }

  /* Print out starting energy, momentum before integrating */
  sunrealtype tret = T0;
  sunrealtype tout = T0 + dTout;
  fprintf(stdout, "t = %.6Lf, x(t) = %.6Lf, E = %.6Lf, sol. err = %.6Lf\n",
          (long double)tret, (long double)ydata[0],
          (long double)Energy(y, dt, &udata), (long double)SUN_RCONST(0.0));

  /* Do integration */
  for (iout = 0; iout < num_output_times; iout++)
  {
    if (args.use_tstop) { ARKodeSetStopTime(arkode_mem, tout); }
    retval = ARKodeEvolve(arkode_mem, tout, y, &tret, ARK_NORMAL);

    /* Compute the analytical solution */
    Solution(tret, y, solution, &udata);

    /* Compute L2 error */
    N_VLinearSum(SUN_RCONST(1.0), y, -SUN_RCONST(1.0), solution, solution);
    sunrealtype err = sqrt(N_VDotProd(solution, solution));

    /* Output current integration status */
    fprintf(stdout, "t = %.6Lf, x(t) = %.6Lf, E = %.6Lf, sol. err = %.16Le\n",
            (long double)tret, (long double)ydata[0],
            (long double)Energy(y, dt, &udata), (long double)err);

    /* Check that solution error is within tolerance */
    if (err > SUNMAX(dt / pow(10, order - 2), 1000 * SUN_UNIT_ROUNDOFF))
    {
      fprintf(stderr, "FAILURE: solution error is too high\n");
      return 1;
    }

    /* Check if the solve was successful, if so, update the time and continue */
    if (retval >= 0)
    {
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    {
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }

  fprintf(stdout, "\n");
  N_VDestroy(y);
  N_VDestroy(solution);
  ARKodePrintAllStats(arkode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);
  ARKodeFree(&arkode_mem);
  SUNContext_Free(&sunctx);

  return 0;
}